

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall TPZFrontNonSym<long_double>::Compress(TPZFrontNonSym<long_double> *this)

{
  long *plVar1;
  long *plVar2;
  longdouble *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  longdouble *plVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  TPZStack<long,_10> from;
  TPZManVector<long,_10> TStack_98;
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&TStack_98);
  for (lVar12 = 0; lVar12 < (this->super_TPZFront<long_double>).fFront; lVar12 = lVar12 + 1) {
    if ((this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fStore[lVar12] != -1) {
      TPZStack<long,_10>::Push((TPZStack<long,_10> *)&TStack_98,lVar12);
    }
  }
  plVar1 = (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fStore;
  plVar2 = (this->super_TPZFront<long_double>).fLocal.fStore;
  lVar7 = 0;
  lVar12 = 0;
  if (0 < TStack_98.super_TPZVec<long>.fNElements) {
    lVar12 = TStack_98.super_TPZVec<long>.fNElements;
  }
  for (; lVar12 != lVar7; lVar7 = lVar7 + 1) {
    lVar6 = plVar1[TStack_98.super_TPZVec<long>.fStore[lVar7]];
    plVar1[lVar7] = lVar6;
    plVar2[lVar6] = lVar7;
  }
  plVar1 = (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fStore;
  for (lVar7 = lVar12;
      lVar7 < (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fNElements;
      lVar7 = lVar7 + 1) {
    plVar1[lVar7] = -1;
  }
  if ((this->super_TPZFront<long_double>).fFree.super_TPZManVector<int,_10>.super_TPZVec<int>.
      fNElements + TStack_98.super_TPZVec<long>.fNElements !=
      (this->super_TPZFront<long_double>).fFront) {
    std::operator<<((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n");
  }
  (this->super_TPZFront<long_double>).fFront = TStack_98.super_TPZVec<long>.fNElements;
  TPZManVector<int,_10>::Resize
            (&(this->super_TPZFront<long_double>).fFree.super_TPZManVector<int,_10>,0);
  TPZManVector<long,_10>::Resize
            (&(this->super_TPZFront<long_double>).fGlobal,(this->super_TPZFront<long_double>).fFront
            );
  if ((this->super_TPZFront<long_double>).fData.fNElements != 0) {
    lVar7 = 0;
    for (lVar6 = 0; lVar6 != lVar12; lVar6 = lVar6 + 1) {
      lVar8 = (long)(this->super_TPZFront<long_double>).fMaxFront;
      plVar3 = (this->super_TPZFront<long_double>).fData.fStore;
      plVar9 = (longdouble *)(lVar7 * lVar8 + (long)plVar3);
      for (lVar10 = 0; TStack_98.super_TPZVec<long>.fNElements != lVar10; lVar10 = lVar10 + 1) {
        lVar4 = TStack_98.super_TPZVec<long>.fStore[lVar10];
        lVar5 = TStack_98.super_TPZVec<long>.fStore[lVar6];
        lVar11 = lVar5 * lVar8;
        *plVar9 = plVar3[lVar11 + lVar4];
        if ((lVar10 != lVar4) || (lVar5 != lVar6)) {
          plVar3[lVar11 + lVar4] = (longdouble)0;
        }
        plVar9 = plVar9 + 1;
      }
      lVar7 = lVar7 + 0x10;
    }
  }
  TPZManVector<long,_10>::~TPZManVector(&TStack_98);
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress");
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//this->fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i < nfound; i++){
			Element(i,j) = Element(from[i], from[j]);
			if(from[i]!=i || from[j]!=j) Element(from[i],from[j])=0.;
		}
	}
}